

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

Node * __thiscall rengine::TestBase::update(TestBase *this,Node *root)

{
  _List_node_base *p_Var1;
  StaticRenderTest *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  
  if (root != (Node *)0x0) {
    (*(root->super_SignalEmitter)._vptr_SignalEmitter[2])(root);
  }
  p_Var1 = (this->tests).
           super__List_base<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->tests) {
    this->m_currentTest = (StaticRenderTest *)p_Var1[1]._M_next;
    std::__cxx11::list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::
    pop_front(&this->tests);
    pSVar2 = this->m_currentTest;
    pSVar2->m_surface = (Surface *)this;
    iVar3 = (**pSVar2->_vptr_StaticRenderTest)();
    return (Node *)CONCAT44(extraout_var,iVar3);
  }
  return (Node *)0x0;
}

Assistant:

Node *update(Node *root) override {
        if (root)
            root->destroy();

        if (tests.empty())
            return 0;

        m_currentTest = tests.front();
        tests.pop_front();

        m_currentTest->setSurface(this);

        return m_currentTest->build();
    }